

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_fini.c
# Opt level: O3

void mpt_path_fini(mpt_path *path)

{
  char *pcVar1;
  
  if ((path->flags & 0x40) != 0) {
    path->flags = path->flags & 0xbf;
    path->off = 0;
    path->len = 0;
    pcVar1 = path->base;
    if (pcVar1 != (char *)0x0) {
      (**(code **)(*(long *)(pcVar1 + -0x20) + 8))(pcVar1 + -0x20);
      path->base = (char *)0x0;
    }
  }
  return;
}

Assistant:

extern void mpt_path_fini(MPT_STRUCT(path) *path)
{
	MPT_STRUCT(buffer) *buf;
	
	if (!(path->flags & MPT_PATHFLAG(HasArray))) {
		return;
	}
	path->flags &= ~MPT_PATHFLAG(HasArray);
	path->off = path->len = 0;
	
	if (!(buf = (void *) path->base)) {
		return;
	}
	--buf;
	buf->_vptr->unref(buf);
	path->base = 0;
}